

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O3

void __thiscall pstack::Dwarf::CIE::CIE(CIE *this,CFI *fi,DWARFReader *r,Off end_)

{
  byte bVar1;
  element_type *peVar2;
  size_type sVar3;
  pointer pcVar4;
  CIE *pCVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  long extraout_RDX;
  Off OVar9;
  long extraout_RDX_00;
  long extraout_RDX_01;
  Off OVar10;
  size_type sVar11;
  pair<unsigned_long,_bool> pVar12;
  Off local_70;
  undefined1 local_58 [8];
  uchar q;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  CIE *local_38;
  
  this->frameInfo = fi;
  this->addressEncoding = '\0';
  this->addressSize = '\b';
  this->segmentSize = '\0';
  this->lsdaEncoding = '\0';
  this->isSignalHandler = false;
  this->initial_instructions = 0;
  this->end = end_;
  (this->personality).first = 0;
  (this->personality).second = false;
  (this->augmentation)._M_dataplus._M_p = (pointer)&(this->augmentation).field_2;
  (this->augmentation)._M_string_length = 0;
  (this->augmentation).field_2._M_local_buf[0] = '\0';
  Reader::readObj<unsigned_char>
            ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             r->off,local_58,1);
  r->off = r->off + 1;
  this->version = local_58[0];
  (*((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Reader[7])();
  r->off = _q + r->off + 1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->augmentation,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
  }
  if (3 < this->version) {
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r->off,local_58,1);
    OVar10 = r->off + 1;
    r->off = OVar10;
    this->addressSize = local_58[0];
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               OVar10,local_58,1);
    r->off = r->off + 1;
    this->segmentSize = local_58[0];
  }
  peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar6 = (*peVar2->_vptr_Reader[3])(peVar2,r->off);
  OVar9 = extraout_RDX + r->off;
  r->off = OVar9;
  this->codeAlign = uVar6;
  peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar7 = (*peVar2->_vptr_Reader[4])(peVar2,OVar9);
  OVar10 = extraout_RDX_00 + r->off;
  r->off = OVar10;
  this->dataAlign = iVar7;
  Reader::readObj<unsigned_char>
            ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             OVar10,local_58,1);
  local_70 = r->off + 1;
  r->off = local_70;
  this->rar = (uint)local_58[0];
  this->addressEncoding = '\x04';
  sVar3 = (this->augmentation)._M_string_length;
  local_38 = this;
  if (sVar3 != 0) {
    pcVar4 = (this->augmentation)._M_dataplus._M_p;
    sVar11 = 0;
    do {
      bVar1 = pcVar4[sVar11];
      switch(bVar1) {
      case 0x4c:
        Reader::readObj<unsigned_char>
                  ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,r->off,local_58,1);
        r->off = r->off + 1;
        local_38->lsdaEncoding = local_58[0];
        break;
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x51:
switchD_00139aa8_caseD_4d:
        poVar8 = ((fi->dwarf->elf).
                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 context->debug;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"unknown augmentation \'",0x16);
        local_58[0] = bVar1;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_58,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' in ",5);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(local_38->augmentation)._M_dataplus._M_p,
                            (local_38->augmentation)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        goto LAB_00139b6f;
      case 0x50:
        Reader::readObj<unsigned_char>
                  ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,r->off,local_58,1);
        r->off = r->off + 1;
        pVar12 = CFI::decodeAddress(fi,r,local_58[0],fi->sectionAddr);
        (local_38->personality).first = pVar12.first;
        (local_38->personality).second = pVar12.second;
        break;
      case 0x52:
        Reader::readObj<unsigned_char>
                  ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,r->off,local_58,1);
        r->off = r->off + 1;
        local_38->addressEncoding = local_58[0];
        break;
      case 0x53:
        local_38->isSignalHandler = true;
        break;
      default:
        if (bVar1 != 0) {
          if (bVar1 != 0x7a) goto switchD_00139aa8_caseD_4d;
          peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar7 = (*peVar2->_vptr_Reader[3])(peVar2,r->off);
          local_70 = extraout_RDX_01 + r->off;
          r->off = local_70;
          local_70 = local_70 + CONCAT44(extraout_var,iVar7);
        }
      }
      sVar11 = sVar11 + 1;
    } while (sVar3 != sVar11);
  }
LAB_00139b6f:
  pCVar5 = local_38;
  if (r->off != local_70) {
    poVar8 = ((fi->dwarf->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->context->debug;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"warning: ",9);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," bytes of augmentation ignored",0x1e)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (r->end < local_70) {
      __assert_fail("end >= off_",
                    "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/dwarf.h"
                    ,0x3b2,"void pstack::Dwarf::DWARFReader::setOffset(Elf::Off)");
    }
    r->off = local_70;
  }
  pCVar5->initial_instructions = local_70;
  return;
}

Assistant:

CIE::CIE(const CFI *fi, DWARFReader &r, Elf::Off end_)
    : frameInfo(fi)
    , addressEncoding(0)
    , addressSize(ELF_BYTES)
    , segmentSize(0)
    , lsdaEncoding(0)
    , isSignalHandler(false)
    , initial_instructions(0)
    , end(end_)
    , personality{}
{
    version = r.getu8();
    augmentation = r.getstring();
    if (version >= 4) {
        addressSize = r.getu8();
        segmentSize = r.getu8();
    }
    codeAlign = r.getuleb128();
    dataAlign = r.getsleb128();
    rar = r.getu8();

#if ELF_BITS == 32
    addressEncoding = DW_EH_PE_udata4;
#elif ELF_BITS == 64
    addressEncoding = DW_EH_PE_udata8;
#else
    #error "no default address encoding"
#endif

    bool earlyExit = false;
    Elf::Off endaugdata = r.getOffset();
    for (auto aug : augmentation) {
        switch (aug) {
            case 'z':
                endaugdata = r.getuleb128();
                endaugdata += r.getOffset();
                break;
            case 'P':
                personality = fi->decodeAddress(r, r.getu8(), fi->sectionAddr );
                break;
            case 'L':
                lsdaEncoding = r.getu8();
                break;
            case 'R':
                addressEncoding = r.getu8();
                break;
            case 'S':
                isSignalHandler = true;
                break;
            case '\0':
                break;
            default:
                *fi->dwarf->elf->context.debug << "unknown augmentation '" << aug << "' in " << augmentation << std::endl;
                // The augmentations are in order, so we can't make any sense
                // of the remaining data in the augmentation block
                earlyExit = true;
                break;
        }
        if (earlyExit)
            break;
    }
    if (r.getOffset() != endaugdata) {
        *fi->dwarf->elf->context.debug << "warning: " << endaugdata - r.getOffset() << " bytes of augmentation ignored" << std::endl;
        r.setOffset(endaugdata);
    }
    initial_instructions = r.getOffset();
}